

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * __thiscall
lest::make_string<char,int,double,char_const*>
          (string *__return_storage_ptr__,lest *this,tuple<char,_int,_double,_const_char_*> *tuple)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  make_tuple_string<std::tuple<char,int,double,char_const*>,4ul>::make_abi_cxx11_
            (&local_30,(make_tuple_string<std::tuple<char,int,double,char_const*>,4ul> *)this,tuple)
  ;
  std::operator+(&local_50,"{ ",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,"}");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( std::tuple<TS...> const & tuple ) -> std::string
{
    return "{ " + make_tuple_string<std::tuple<TS...>, sizeof...(TS)>::make( tuple ) + "}";
}